

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

size_t aead_encrypt(st_ptls_traffic_protection_t *ctx,void *output,void *input,size_t inlen,
                   uint8_t content_type)

{
  st_ptls_aead_context_t *psVar1;
  st_ptls_aead_algorithm_t *psVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  uint8_t aad [5];
  uint8_t iv [16];
  uint8_t local_56;
  undefined2 local_55;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  void *local_50;
  undefined1 local_48 [24];
  
  psVar1 = ctx->aead;
  psVar2 = psVar1->algo;
  lVar6 = inlen + 1 + psVar2->tag_size;
  local_55 = 0x317;
  local_53 = 3;
  local_52 = (undefined1)((ulong)lVar6 >> 8);
  local_51 = (undefined1)lVar6;
  uVar3 = ctx->seq;
  ctx->seq = uVar3 + 1;
  sVar7 = psVar2->iv_size;
  local_56 = content_type;
  local_50 = input;
  if (sVar7 - 8 != 0) {
    memcpy(local_48,psVar1->static_iv,sVar7 - 8);
  }
  lVar6 = 0x38;
  do {
    local_48[sVar7 - 8] = (byte)(uVar3 >> ((byte)lVar6 & 0x3f)) ^ psVar1->static_iv[sVar7 - 8];
    lVar6 = lVar6 + -8;
    sVar7 = sVar7 + 1;
  } while (lVar6 != -8);
  (*psVar1->do_encrypt_init)(psVar1,local_48,&local_55,5);
  sVar7 = (*ctx->aead->do_encrypt_update)(ctx->aead,output,local_50,inlen);
  sVar4 = (*ctx->aead->do_encrypt_update)(ctx->aead,(void *)((long)output + sVar7),&local_56,1);
  sVar5 = (*ctx->aead->do_encrypt_final)(ctx->aead,(void *)((long)output + sVar4 + sVar7));
  return sVar5 + sVar4 + sVar7;
}

Assistant:

static size_t aead_encrypt(struct st_ptls_traffic_protection_t *ctx, void *output, const void *input, size_t inlen,
                           uint8_t content_type)
{
    uint8_t aad[5];
    size_t off = 0;

    build_aad(aad, inlen + 1 + ctx->aead->algo->tag_size);
    ptls_aead_encrypt_init(ctx->aead, ctx->seq++, aad, sizeof(aad));
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, input, inlen);
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, &content_type, 1);
    off += ptls_aead_encrypt_final(ctx->aead, ((uint8_t *)output) + off);

    return off;
}